

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::JunitReporter::testCaseEnded(JunitReporter *this,TestCaseStats *testCaseStats)

{
  std::__cxx11::string::_M_append
            ((char *)&this->stdOutForSuite,(ulong)(testCaseStats->stdOut)._M_dataplus._M_p);
  std::__cxx11::string::_M_append
            ((char *)&this->stdErrForSuite,(ulong)(testCaseStats->stdErr)._M_dataplus._M_p);
  CumulativeReporterBase<Catch::JunitReporter>::testCaseEnded
            (&this->super_CumulativeReporterBase<Catch::JunitReporter>,testCaseStats);
  return;
}

Assistant:

void JunitReporter::testCaseEnded( TestCaseStats const& testCaseStats ) {
        stdOutForSuite += testCaseStats.stdOut;
        stdErrForSuite += testCaseStats.stdErr;
        CumulativeReporterBase::testCaseEnded( testCaseStats );
    }